

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest_main.cc
# Opt level: O3

void gflags::anon_unknown_5::Test_ParseCommandLineFlagsUnknownFlagDeathTest_FlagIsCompletelyUnknown
     ::Run(void)

{
  undefined8 extraout_RAX;
  FlagSaver fs;
  FlagSaver FStack_18;
  
  FlagSaver::FlagSaver(&FStack_18);
  fprintf(_stderr,"Running test %s/%s\n","ParseCommandLineFlagsUnknownFlagDeathTest",
          "FlagIsCompletelyUnknown");
  g_called_exit = 0;
  gflags_exitfunc = CalledExit;
  ParseTestFlag(true,2,&PTR_anon_var_dwarf_1dfd3_0015bcc0);
  _GLOBAL__N_1::Test_ParseCommandLineFlagsUnknownFlagDeathTest_FlagIsCompletelyUnknown::Run();
  g_called_exit = '\0';
  gflags_exitfunc = CalledExit;
  ParseTestFlag(false,2,&PTR_anon_var_dwarf_1dfd3_0015bcc0);
  gflags_exitfunc = exit;
  if (g_called_exit != '\0') {
    FlagSaver::~FlagSaver(&FStack_18);
    return;
  }
  _GLOBAL__N_1::Test_ParseCommandLineFlagsUnknownFlagDeathTest_FlagIsCompletelyUnknown::Run();
  FlagSaver::~FlagSaver(&FStack_18);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

TEST(ParseCommandLineFlagsUnknownFlagDeathTest,
     FlagIsCompletelyUnknown) {
  const char* argv[] = {
    "my_test",
    "--this_flag_does_not_exist",
    NULL,
  };

  EXPECT_DEATH(ParseTestFlag(true, arraysize(argv) - 1, argv),
               "unknown command line flag.*");
  EXPECT_DEATH(ParseTestFlag(false, arraysize(argv) - 1, argv),
               "unknown command line flag.*");
}